

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O0

bool __thiscall
QHstsHeaderParser::processDirective(QHstsHeaderParser *this,QByteArray *name,QByteArray *value)

{
  QByteArrayView value_00;
  QByteArrayView a;
  QByteArrayView a_00;
  int iVar1;
  qsizetype qVar2;
  qlonglong qVar3;
  undefined8 in_RDX;
  QByteArrayView *in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  qint64 age;
  bool ok;
  QByteArrayView unescapedValue;
  int in_stack_ffffffffffffff6c;
  bool *in_stack_ffffffffffffff70;
  CaseSensitivity cs;
  QByteArrayView *this_00;
  bool local_51;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar4;
  storage_type *in_stack_ffffffffffffffc8;
  QByteArrayView local_28 [2];
  long local_8;
  
  cs = (CaseSensitivity)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  QByteArrayView::QByteArrayView<8ul>(in_RSI,(char (*) [8])in_RDI);
  a.m_size._7_1_ = in_stack_ffffffffffffffc7;
  a.m_size._0_7_ = in_stack_ffffffffffffffc0;
  a.m_data = in_stack_ffffffffffffffc8;
  iVar1 = QByteArray::compare((QByteArray *)this_00,a,cs);
  if (iVar1 == 0) {
    if (((ulong)in_RDI[3].m_data & 0x100000000) != 0) {
      local_51 = false;
      goto LAB_0017aae7;
    }
    local_28[0].m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
    local_28[0].m_size = -0x5555555555555556;
    QByteArrayView::QByteArrayView<QByteArray,_true>(in_RSI,(QByteArray *)in_RDI);
    value_00.m_data = (storage_type *)in_RDI;
    value_00.m_size = (qsizetype)in_stack_ffffffffffffff70;
    local_28[0] = unescapeMaxAge(value_00);
    qVar2 = QByteArrayView::size(local_28);
    if (qVar2 == 0) {
      local_51 = false;
      goto LAB_0017aae7;
    }
    bVar4 = 0;
    qVar3 = QByteArrayView::toLongLong(in_RDI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    if (((bVar4 & 1) == 0) || (qVar3 < 0)) {
      local_51 = false;
      goto LAB_0017aae7;
    }
    in_RDI[4].m_size = qVar3;
    *(undefined1 *)((long)&in_RDI[3].m_data + 4) = 1;
  }
  else {
    QByteArrayView::QByteArrayView<18ul>(in_RSI,(char (*) [18])in_RDI);
    a_00.m_size._7_1_ = in_stack_ffffffffffffffc7;
    a_00.m_size._0_7_ = in_stack_ffffffffffffffc0;
    a_00.m_data = in_stack_ffffffffffffffc8;
    iVar1 = QByteArray::compare((QByteArray *)this_00,a_00,cs);
    if (iVar1 == 0) {
      if (((ulong)in_RDI[4].m_data & 1) != 0) {
        local_51 = false;
        goto LAB_0017aae7;
      }
      *(undefined1 *)&in_RDI[4].m_data = 1;
    }
  }
  local_51 = true;
LAB_0017aae7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_51;
}

Assistant:

bool QHstsHeaderParser::processDirective(const QByteArray &name, const QByteArray &value)
{
    Q_ASSERT(name.size());
    // RFC6797 6.1/3 Directive names are case-insensitive
    if (name.compare("max-age", Qt::CaseInsensitive) == 0) {
        // RFC 6797, 6.1.1
        // The syntax of the max-age directive's REQUIRED value (after
        // quoted-string unescaping, if necessary) is defined as:
        //
        // max-age-value = delta-seconds
        if (maxAgeFound) {
            // RFC 6797, 6.1/2:
            // All directives MUST appear only once in an STS header field.
            return false;
        }

        const QByteArrayView unescapedValue = unescapeMaxAge(value);
        if (!unescapedValue.size())
            return false;

        bool ok = false;
        const qint64 age = unescapedValue.toLongLong(&ok);
        if (!ok || age < 0)
            return false;

        maxAge = age;
        maxAgeFound = true;
    } else if (name.compare("includesubdomains", Qt::CaseInsensitive) == 0) {
        // RFC 6797, 6.1.2.  The includeSubDomains Directive.
        // The OPTIONAL "includeSubDomains" directive is a valueless directive.

        if (subDomainsFound) {
            // RFC 6797, 6.1/2:
            // All directives MUST appear only once in an STS header field.
            return false;
        }

        subDomainsFound = true;
    } // else we do nothing, skip unknown directives (RFC 6797, 6.1/5)

    return true;
}